

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode libcurl_generate_slist(curl_slist *slist,int *slistno)

{
  CURLcode CVar1;
  char *__ptr;
  
  easysrc_slist_count = easysrc_slist_count + 1;
  *slistno = easysrc_slist_count;
  CVar1 = easysrc_addf(&easysrc_decl,"struct curl_slist *slist%d;");
  if ((((CVar1 == CURLE_OK) &&
       (CVar1 = easysrc_addf(&easysrc_data,"slist%d = NULL;",(ulong)(uint)*slistno),
       CVar1 == CURLE_OK)) &&
      (CVar1 = easysrc_addf(&easysrc_clean,"curl_slist_free_all(slist%d);",(ulong)(uint)*slistno),
      CVar1 == CURLE_OK)) &&
     (CVar1 = easysrc_addf(&easysrc_clean,"slist%d = NULL;",(ulong)(uint)*slistno),
     CVar1 == CURLE_OK)) {
    CVar1 = CURLE_OK;
    while( true ) {
      if (slist == (curl_slist *)0x0) {
        return CVar1;
      }
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      __ptr = c_escape(slist->data,-1);
      if (__ptr == (char *)0x0) break;
      CVar1 = easysrc_addf(&easysrc_data,"slist%d = curl_slist_append(slist%d, \"%s\");",
                           (ulong)(uint)*slistno,(ulong)(uint)*slistno,__ptr);
      free(__ptr);
      slist = slist->next;
    }
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  return CVar1;
}

Assistant:

static CURLcode libcurl_generate_slist(struct curl_slist *slist, int *slistno)
{
  CURLcode ret = CURLE_OK;

  /* May need several slist variables, so invent name */
  *slistno = ++easysrc_slist_count;

  ret = easysrc_addf(&easysrc_decl, "struct curl_slist *slist%d;", *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_data, "slist%d = NULL;", *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "curl_slist_free_all(slist%d);",
                       *slistno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "slist%d = NULL;", *slistno);
  if(ret)
    return ret;
  for(; slist && !ret; slist = slist->next) {
    char *escaped = c_escape(slist->data, ZERO_TERMINATED);
    if(!escaped)
      return CURLE_OUT_OF_MEMORY;
    ret = easysrc_addf(&easysrc_data,
                       "slist%d = curl_slist_append(slist%d, \"%s\");",
                       *slistno, *slistno, escaped);
    free(escaped);
  }

  return ret;
}